

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::CopyADirectory(string *source,string *destination,bool always)

{
  pointer pcVar1;
  bool bVar2;
  unsigned_long uVar3;
  char *pcVar4;
  ulong dindex;
  Directory dir;
  string fullPath;
  string fullDestPath;
  Directory local_80;
  uint local_74;
  string local_70;
  string local_50;
  
  Directory::Directory(&local_80);
  bVar2 = Directory::Load(&local_80,source);
  if ((bVar2) && (bVar2 = MakeDirectory(destination,(mode_t *)0x0), bVar2)) {
    local_74 = (uint)always;
    for (dindex = 0; uVar3 = Directory::GetNumberOfFiles(&local_80), dindex < uVar3;
        dindex = dindex + 1) {
      pcVar4 = Directory::GetFile(&local_80,dindex);
      if (((*pcVar4 != '.') || (pcVar4[1] != '\0')) &&
         ((pcVar4 = Directory::GetFile(&local_80,dindex), *pcVar4 != '.' ||
          ((pcVar4[1] != '.' || (pcVar4[2] != '\0')))))) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar1 = (source->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar1,pcVar1 + source->_M_string_length);
        std::__cxx11::string::append((char *)&local_70);
        Directory::GetFile(&local_80,dindex);
        std::__cxx11::string::append((char *)&local_70);
        bVar2 = FileIsDirectory(&local_70);
        if (bVar2) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          pcVar1 = (destination->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar1,pcVar1 + destination->_M_string_length);
          std::__cxx11::string::append((char *)&local_50);
          Directory::GetFile(&local_80,dindex);
          std::__cxx11::string::append((char *)&local_50);
          bVar2 = CopyADirectory(&local_70,&local_50,SUB41(local_74,0));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (bVar2) {
LAB_003ab93f:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            goto LAB_003ab95b;
          }
        }
        else {
          if (always) {
            bVar2 = CopyFileAlways(&local_70,destination);
          }
          else {
            bVar2 = CopyFileIfDifferent(&local_70,destination);
          }
          if (bVar2 != false) goto LAB_003ab93f;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        goto LAB_003ab983;
      }
LAB_003ab95b:
    }
    bVar2 = true;
  }
  else {
LAB_003ab983:
    bVar2 = false;
  }
  Directory::~Directory(&local_80);
  return bVar2;
}

Assistant:

bool SystemTools::CopyADirectory(const std::string& source,
                                 const std::string& destination, bool always)
{
  Directory dir;
  if (dir.Load(source) == 0) {
    return false;
  }
  size_t fileNum;
  if (!SystemTools::MakeDirectory(destination)) {
    return false;
  }
  for (fileNum = 0; fileNum < dir.GetNumberOfFiles(); ++fileNum) {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), ".") &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), "..")) {
      std::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if (SystemTools::FileIsDirectory(fullPath)) {
        std::string fullDestPath = destination;
        fullDestPath += "/";
        fullDestPath += dir.GetFile(static_cast<unsigned long>(fileNum));
        if (!SystemTools::CopyADirectory(fullPath, fullDestPath, always)) {
          return false;
        }
      } else {
        if (!SystemTools::CopyAFile(fullPath, destination, always)) {
          return false;
        }
      }
    }
  }

  return true;
}